

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

ostream * tcu::operator<<(ostream *str,CubeFace face)

{
  long lVar1;
  char *pcVar2;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    pcVar2 = "CUBEFACE_NEGATIVE_X";
    break;
  case CUBEFACE_POSITIVE_X:
    pcVar2 = "CUBEFACE_POSITIVE_X";
    break;
  case CUBEFACE_NEGATIVE_Y:
    pcVar2 = "CUBEFACE_NEGATIVE_Y";
    break;
  case CUBEFACE_POSITIVE_Y:
    pcVar2 = "CUBEFACE_POSITIVE_Y";
    break;
  case CUBEFACE_NEGATIVE_Z:
    pcVar2 = "CUBEFACE_NEGATIVE_Z";
    break;
  case CUBEFACE_POSITIVE_Z:
    pcVar2 = "CUBEFACE_POSITIVE_Z";
    break;
  case CUBEFACE_LAST:
    pcVar2 = "CUBEFACE_LAST";
    lVar1 = 0xd;
    goto LAB_005e2f82;
  default:
    std::__ostream_insert<char,std::char_traits<char>>(str,"UNKNOWN(",8);
    str = (ostream *)std::ostream::operator<<(str,face);
    pcVar2 = ")";
    lVar1 = 1;
    goto LAB_005e2f82;
  }
  lVar1 = 0x13;
LAB_005e2f82:
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar2,lVar1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, CubeFace face)
{
	switch (face)
	{
		case CUBEFACE_NEGATIVE_X:	return str << "CUBEFACE_NEGATIVE_X";
		case CUBEFACE_POSITIVE_X:	return str << "CUBEFACE_POSITIVE_X";
		case CUBEFACE_NEGATIVE_Y:	return str << "CUBEFACE_NEGATIVE_Y";
		case CUBEFACE_POSITIVE_Y:	return str << "CUBEFACE_POSITIVE_Y";
		case CUBEFACE_NEGATIVE_Z:	return str << "CUBEFACE_NEGATIVE_Z";
		case CUBEFACE_POSITIVE_Z:	return str << "CUBEFACE_POSITIVE_Z";
		case CUBEFACE_LAST:			return str << "CUBEFACE_LAST";
		default:					return str << "UNKNOWN(" << (int)face << ")";
	}
}